

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indexgenerator.cpp
# Opt level: O1

size_t meshopt_generateVertexRemap
                 (uint *destination,uint *indices,size_t index_count,void *vertices,
                 size_t vertex_count,size_t vertex_size)

{
  undefined8 *puVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  uint *puVar5;
  uint uVar6;
  ulong buckets;
  long lVar7;
  uint uVar8;
  size_t sVar9;
  uint index;
  VertexHasher hasher;
  meshopt_Allocator allocator;
  uint local_120;
  uint local_11c;
  uint *local_118;
  VertexHasher local_110;
  undefined8 local_f8 [24];
  long local_38;
  
  memset(local_f8,0,200);
  memset(destination,0xff,vertex_count * 4);
  uVar3 = 1;
  do {
    buckets = uVar3;
    uVar3 = buckets * 2;
  } while (buckets < (vertex_count >> 2) + vertex_count);
  local_110.vertices = (uchar *)vertices;
  local_110.vertex_size = vertex_size;
  local_110.vertex_stride = vertex_size;
  puVar5 = (uint *)(*meshopt_Allocator::StorageT<void>::allocate)
                             (-(ulong)(buckets >> 0x3e != 0) | buckets * 4);
  puVar1 = local_f8 + local_38;
  local_38 = local_38 + 1;
  *puVar1 = puVar5;
  memset(puVar5,0xff,buckets * 4);
  sVar9 = 0;
  lVar7 = local_38;
  if (index_count != 0) {
    uVar2 = 0;
    sVar9 = 0;
    local_118 = puVar5;
    do {
      if (indices == (uint *)0x0) {
        uVar8 = (uint)sVar9;
      }
      else {
        uVar8 = indices[sVar9];
      }
      local_11c = uVar8;
      if (destination[uVar8] == 0xffffffff) {
        local_120 = 0xffffffff;
        puVar5 = meshopt::hashLookup<unsigned_int,meshopt::VertexHasher>
                           (local_118,buckets,&local_110,&local_11c,&local_120);
        if ((ulong)*puVar5 == 0xffffffff) {
          *puVar5 = uVar8;
          uVar6 = uVar2 + 1;
          uVar4 = uVar2;
        }
        else {
          uVar4 = destination[*puVar5];
          uVar6 = uVar2;
        }
        destination[uVar8] = uVar4;
        uVar2 = uVar6;
      }
      sVar9 = sVar9 + 1;
    } while (index_count != sVar9);
    sVar9 = (size_t)uVar2;
    lVar7 = local_38;
  }
  while (lVar7 != 0) {
    (*meshopt_Allocator::StorageT<void>::deallocate)((void *)local_f8[lVar7 + -1]);
    lVar7 = lVar7 + -1;
  }
  return sVar9;
}

Assistant:

size_t meshopt_generateVertexRemap(unsigned int* destination, const unsigned int* indices, size_t index_count, const void* vertices, size_t vertex_count, size_t vertex_size)
{
	using namespace meshopt;

	assert(indices || index_count == vertex_count);
	assert(index_count % 3 == 0);
	assert(vertex_size > 0 && vertex_size <= 256);

	meshopt_Allocator allocator;

	memset(destination, -1, vertex_count * sizeof(unsigned int));

	VertexHasher hasher = {static_cast<const unsigned char*>(vertices), vertex_size, vertex_size};

	size_t table_size = hashBuckets(vertex_count);
	unsigned int* table = allocator.allocate<unsigned int>(table_size);
	memset(table, -1, table_size * sizeof(unsigned int));

	unsigned int next_vertex = 0;

	for (size_t i = 0; i < index_count; ++i)
	{
		unsigned int index = indices ? indices[i] : unsigned(i);
		assert(index < vertex_count);

		if (destination[index] == ~0u)
		{
			unsigned int* entry = hashLookup(table, table_size, hasher, index, ~0u);

			if (*entry == ~0u)
			{
				*entry = index;

				destination[index] = next_vertex++;
			}
			else
			{
				assert(destination[*entry] != ~0u);

				destination[index] = destination[*entry];
			}
		}
	}

	assert(next_vertex <= vertex_count);

	return next_vertex;
}